

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleRepeatCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  char __c;
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  const_reference __cont;
  const_reference name;
  size_type __n;
  const_iterator __first;
  const_iterator __last;
  uint local_110;
  allocator<char> local_109;
  uint i;
  allocator<char> local_e1;
  string local_e0 [32];
  string local_c0 [8];
  string result;
  size_type inStringLength;
  value_type *variableName;
  value_type *stringValue;
  string local_80;
  size_type local_60;
  unsigned_long times;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 == 4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_20,2);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmSystemTools::StringToULong(pcVar4,&local_60);
    if (bVar2) {
      __cont = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,1);
      name = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,3);
      result.field_2._8_8_ = std::__cxx11::string::size();
      std::__cxx11::string::string(local_c0);
      if (result.field_2._8_8_ != 0) {
        if (result.field_2._8_8_ == 1) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__cont);
          __c = *pcVar4;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_e0,local_60,__c,&local_e1);
          std::__cxx11::string::operator=(local_c0,local_e0);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator(&local_e1);
        }
        else {
          __n = result.field_2._8_8_ * local_60;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&i,__n,'\0',&local_109);
          std::__cxx11::string::operator=(local_c0,(string *)&i);
          std::__cxx11::string::~string((string *)&i);
          std::allocator<char>::~allocator(&local_109);
          for (local_110 = 0; local_110 < local_60; local_110 = local_110 + 1) {
            __first = std::cbegin<std::__cxx11::string>(__cont);
            __last = std::cend<std::__cxx11::string>(__cont);
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_c0);
            std::copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char*>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )__first._M_current,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )__last._M_current,pcVar4);
          }
        }
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,name,pcVar4);
      this_local._7_1_ = 1;
      std::__cxx11::string::~string(local_c0);
    }
    else {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"repeat count is not a positive number.",
                 (allocator<char> *)((long)&stringValue + 7));
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&stringValue + 7));
      this_local._7_1_ = 1;
    }
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command REPEAT requires three arguments.",&local_41);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmStringCommand::HandleRepeatCommand(std::vector<std::string> const& args)
{
  // `string(REPEAT "<str>" <times> OUTPUT_VARIABLE)`
  enum ArgPos : std::size_t
  {
    SUB_COMMAND,
    VALUE,
    TIMES,
    OUTPUT_VARIABLE,
    TOTAL_ARGS
  };

  if (args.size() != ArgPos::TOTAL_ARGS) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "sub-command REPEAT requires three arguments.");
    return true;
  }

  unsigned long times;
  if (!cmSystemTools::StringToULong(args[ArgPos::TIMES].c_str(), &times)) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 "repeat count is not a positive number.");
    return true;
  }

  const auto& stringValue = args[ArgPos::VALUE];
  const auto& variableName = args[ArgPos::OUTPUT_VARIABLE];
  const auto inStringLength = stringValue.size();

  std::string result;
  switch (inStringLength) {
    case 0u:
      // Nothing to do for zero length input strings
      break;
    case 1u:
      // NOTE If the string to repeat consists of the only character,
      // use the appropriate constructor.
      result = std::string(times, stringValue[0]);
      break;
    default:
      result = std::string(inStringLength * times, char{});
      for (auto i = 0u; i < times; ++i) {
        std::copy(cm::cbegin(stringValue), cm::cend(stringValue),
                  &result[i * inStringLength]);
      }
      break;
  }

  this->Makefile->AddDefinition(variableName, result.c_str());
  return true;
}